

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndMissingDependentProperties
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SValue *sourceName)

{
  undefined8 rhs;
  bool bVar1;
  SizeType length;
  StringRefType *rhs_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  CrtAllocator *pCVar3;
  ValueType *pVVar4;
  Ch *name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_198;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_188;
  undefined1 local_178 [8];
  ValueType wrapper;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_130;
  PointerType local_f8;
  PointerType local_c0;
  undefined1 local_88 [8];
  PointerType schemaRef;
  GenericStringRef<char> local_40;
  ValidateErrorCode local_2c;
  undefined1 local_28 [4];
  ValidateErrorCode code;
  ValueType error;
  SValue *sourceName_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  error.data_.o.members = (Member *)sourceName;
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Empty
                    (&this->missingDependents_);
  if (!bVar1) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,kObjectType)
    ;
    local_2c = kValidateErrorRequired;
    rhs_00 = GetMissingString();
    GenericStringRef<char>::GenericStringRef(&local_40,rhs_00);
    pGVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move
                       (&this->missingDependents_);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,&local_40,
               pGVar2,pCVar3);
    AddErrorCode(this,(ValueType *)local_28,local_2c);
    AddErrorInstanceLocation(this,(ValueType *)local_28,false);
    GetInvalidSchemaPointer(&local_c0,this);
    pVVar4 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetValidateErrorKeyword(kValidateErrorDependencies);
    GetInvalidSchemaPointer(&local_f8,this);
    pCVar3 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             ::GetAllocator(&local_f8);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Append((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *)local_88,&local_c0,pVVar4,pCVar3);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_f8);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_c0);
    name = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     (error.data_.a.elements);
    length = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                       (error.data_.a.elements);
    GetInvalidSchemaPointer((PointerType *)((long)&wrapper.data_ + 8),this);
    pCVar3 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             ::GetAllocator((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                             *)((long)&wrapper.data_ + 8));
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Append(&local_130,
             (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *)local_88,name,length,pCVar3);
    AddErrorSchemaLocation(this,(ValueType *)local_28,&local_130);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_130);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)((long)&wrapper.data_ + 8));
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_178,kObjectType
              );
    pVVar4 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetValidateErrorKeyword(local_2c);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
    GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&local_188,pVVar4,
               pCVar3,false);
    pGVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_188);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_178,pGVar2,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,pCVar3);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_188);
    rhs = error.data_.s.str;
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    GenericValue<rapidjson::CrtAllocator>
              (&local_198,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)rhs,pCVar3
               ,false);
    pGVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_198);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->currentError_,pGVar2,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_178,pCVar3);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_198);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_178);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)local_88);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
  }
  return;
}

Assistant:

void EndMissingDependentProperties(const SValue& sourceName) {
        if (!missingDependents_.Empty()) {
            // Create equivalent 'required' error
            ValueType error(kObjectType);
            ValidateErrorCode code = kValidateErrorRequired;
            error.AddMember(GetMissingString(), missingDependents_.Move(), GetStateAllocator());
            AddErrorCode(error, code);
            AddErrorInstanceLocation(error, false);
            // When appending to a pointer ensure its allocator is used
            PointerType schemaRef = GetInvalidSchemaPointer().Append(SchemaType::GetValidateErrorKeyword(kValidateErrorDependencies), &GetInvalidSchemaPointer().GetAllocator());
            AddErrorSchemaLocation(error, schemaRef.Append(sourceName.GetString(), sourceName.GetStringLength(), &GetInvalidSchemaPointer().GetAllocator()));
            ValueType wrapper(kObjectType);
            wrapper.AddMember(ValueType(SchemaType::GetValidateErrorKeyword(code), GetStateAllocator()).Move(), error, GetStateAllocator());
            currentError_.AddMember(ValueType(sourceName, GetStateAllocator()).Move(), wrapper, GetStateAllocator());
        }
    }